

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

s2textformat * __thiscall
s2textformat::ToString_abi_cxx11_
          (s2textformat *this,vector<S2LatLng,_std::allocator<S2LatLng>_> *latlngs)

{
  size_type sVar1;
  const_reference ll;
  int local_20;
  int i;
  vector<S2LatLng,_std::allocator<S2LatLng>_> *latlngs_local;
  string *out;
  
  std::__cxx11::string::string((string *)this);
  for (local_20 = 0; sVar1 = std::vector<S2LatLng,_std::allocator<S2LatLng>_>::size(latlngs),
      (ulong)(long)local_20 < sVar1; local_20 = local_20 + 1) {
    if (0 < local_20) {
      std::__cxx11::string::operator+=((string *)this,", ");
    }
    ll = std::vector<S2LatLng,_std::allocator<S2LatLng>_>::operator[](latlngs,(long)local_20);
    AppendVertex(ll,(string *)this);
  }
  return this;
}

Assistant:

string ToString(const vector<S2LatLng>& latlngs) {
  string out;
  for (int i = 0; i < latlngs.size(); ++i) {
    if (i > 0) out += ", ";
    AppendVertex(latlngs[i], &out);
  }
  return out;
}